

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# components.hpp
# Opt level: O0

holder<cs::numeric> * __thiscall
cs::allocator_type<cs_impl::any::holder<cs::numeric>,_64UL,_cs_impl::default_allocator_provider>::
alloc<long_long>(allocator_type<cs_impl::any::holder<cs::numeric>,_64UL,_cs_impl::default_allocator_provider>
                 *this,longlong *args)

{
  long lVar1;
  __int_type _Var2;
  holder<cs::numeric> *phVar3;
  new_allocator<cs_impl::any::holder<cs::numeric>_> *in_RSI;
  new_allocator<cs_impl::any::holder<cs::numeric>_> *in_RDI;
  holder<cs::numeric> *ptr;
  holder<cs::numeric> *in_stack_ffffffffffffffd8;
  size_type __n;
  
  __n = 0;
  if (*(long *)(in_RDI + 0x208) != 0) {
    _Var2 = std::__atomic_base::operator_cast_to_unsigned_long((__atomic_base<unsigned_long> *)0x0);
    if (_Var2 == 0) {
      lVar1 = *(long *)(in_RDI + 0x208);
      *(long *)(in_RDI + 0x208) = lVar1 + -1;
      phVar3 = *(holder<cs::numeric> **)(in_RDI + lVar1 * 8 + -8);
      goto LAB_0029fe22;
    }
  }
  phVar3 = __gnu_cxx::new_allocator<cs_impl::any::holder<cs::numeric>_>::allocate(in_RSI,__n,in_RDI)
  ;
LAB_0029fe22:
  __gnu_cxx::new_allocator<cs_impl::any::holder<cs::numeric>>::
  construct<cs_impl::any::holder<cs::numeric>,long_long>
            (in_RDI,in_stack_ffffffffffffffd8,(longlong *)0x29fe3d);
  return phVar3;
}

Assistant:

inline T *alloc(ArgsT &&...args)
		{
			T *ptr = nullptr;
			if (mOffset > 0 && global_thread_counter == 0)
				ptr = mPool[--mOffset];
			else
				ptr = mAlloc.allocate(1);
			mAlloc.construct(ptr, std::forward<ArgsT>(args)...);
			return ptr;
		}